

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_observer.hpp
# Opt level: O2

void __thiscall
afsm::test::test_fsm_observer::
processed_in_state<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::events::ready_for_query>
          (test_fsm_observer *this,
          state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
          *param_1,ready_for_query *param_2)

{
  long lVar1;
  ostream *poVar2;
  string sStack_48;
  string local_28;
  
  poVar2 = psst::operator<<((ostream *)&std::cerr,blue|dim);
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x11;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x20;
  psst::util::demangle<afsm::test::events::ready_for_query>();
  get_name_components(&local_28,&sStack_48,1);
  poVar2 = std::operator<<(poVar2,(string *)&local_28);
  poVar2 = psst::operator<<(poVar2,clear);
  std::operator<<(poVar2,": Processed in state\n");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

void
    processed_in_state(FSM const&, Event const&) const noexcept
    {
        using ::psst::ansi_color;
        using ::psst::util::demangle;
        ::std::cerr
             << (ansi_color::blue | ansi_color::dim)
             << ::std::setw(event_name_width) << ::std::left
             << get_name_components(demangle<Event>(), 1)
             << ansi_color::clear
             << ": Processed in state\n";
    }